

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapid_json_serial_impl.cpp
# Opt level: O2

void rapid_json_serial_impl_serialize_value(value v,Value *json_v)

{
  char cVar1;
  short sVar2;
  undefined4 uVar3;
  int iVar4;
  int64_t i64;
  undefined1 *puVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 uVar8;
  value v_00;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  Number NVar12;
  undefined1 *puVar13;
  uint16_t uVar14;
  SizeType SVar15;
  _Alloc_hider _Var16;
  size_t iterator_1;
  ulong uVar17;
  size_t iterator;
  long lVar18;
  ushort uVar19;
  bool bVar20;
  float fVar21;
  Value label_member;
  string s;
  Value stacktrace_member;
  Value code_member;
  Data local_1d8;
  Value stacktrace_value;
  Value label_value;
  ostringstream ostream;
  
  uVar3 = value_type_id();
  switch(uVar3) {
  case 0:
    cVar1 = value_to_bool(v);
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = (cVar1 == '\x01') + 9;
    break;
  case 1:
    value_to_char(v);
    (json_v->data_).s.str = (Ch *)((ulong)&ostream | 0x405000000000000);
    (json_v->data_).s.length = 1;
    break;
  case 2:
    sVar2 = value_to_short(v);
    (json_v->data_).s.str = (Ch *)0x0;
    *(long *)&json_v->data_ = (long)sVar2;
    bVar20 = sVar2 < 0;
    goto LAB_00102896;
  case 3:
    iVar4 = value_to_int(v);
    (json_v->data_).s.str = (Ch *)0x0;
    *(long *)&json_v->data_ = (long)iVar4;
    bVar20 = iVar4 < 0;
LAB_00102896:
    uVar14 = 0xb6;
    if (!bVar20) {
      uVar14 = 0x1f6;
    }
    (json_v->data_).f.flags = uVar14;
    break;
  case 4:
    i64 = value_to_long(v);
    log_write_impl_va("metacall",0x6c,"rapid_json_serial_impl_serialize_value",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/serials/rapid_json_serial/source/rapid_json_serial_impl.cpp"
                      ,2,
                      "Casting long to int64_t (posible incompatible types) in RapidJSON implementation"
                     );
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(json_v,i64);
    return;
  case 5:
    fVar21 = (float)value_to_float(v);
    NVar12.d = (double)fVar21;
    goto LAB_00102b24;
  case 6:
    NVar12.i64 = value_to_double(v);
LAB_00102b24:
    (json_v->data_).s.str = (Ch *)0x216000000000000;
    (json_v->data_).n = NVar12;
    break;
  case 7:
    puVar5 = (undefined1 *)value_to_string(v);
    lVar9 = value_type_size(v);
    SVar15 = 0;
    if (lVar9 != 0) {
      SVar15 = (int)lVar9 - 1;
    }
    puVar13 = &rapidjson::GenericStringRef<char>::emptyString;
    if (puVar5 != (undefined1 *)0x0) {
      puVar13 = puVar5;
    }
    (json_v->data_).s.str = (Ch *)((ulong)puVar13 | 0x405000000000000);
    (json_v->data_).s.length = SVar15;
    break;
  case 8:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    _ostream = 0;
    lVar9 = value_to_buffer(v);
    NVar12.i64 = value_type_size(v);
    for (uVar17 = 0; NVar12.i64 != uVar17; uVar17 = uVar17 + 1) {
      s._M_dataplus._M_p = (pointer)(ulong)(uint)(int)*(char *)(lVar9 + uVar17);
      s._M_string_length = (ulong)(-1 < *(char *)(lVar9 + uVar17)) << 0x35 | 0x1d6000000000000;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&ostream,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&s,&rapid_json_allocator);
    }
    s._M_string_length = 0x405000000107484;
    s._M_dataplus._M_p = (pointer)0x4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&s,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&ostream,&rapid_json_allocator);
    s._M_string_length = 0x405000000107489;
    s._M_dataplus._M_p = (pointer)0x6;
    uVar19 = (ushort)((NVar12.u64 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
    if (NVar12.u64 >> 0x20 != 0) {
      uVar19 = (ushort)(-1 < NVar12.i64) << 7 | 0x116;
    }
    label_member.data_.s.str = (Ch *)((ulong)uVar19 << 0x30);
    label_member.data_.n = (Number)NVar12.i64;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&s,&label_member,&rapid_json_allocator);
    break;
  case 9:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 4;
    lVar9 = value_to_array(v);
    lVar10 = value_type_count(v);
    for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
      _ostream = 0;
      rapid_json_serial_impl_serialize_value(*(value *)(lVar9 + lVar18 * 8),(Value *)&ostream);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&ostream,&rapid_json_allocator);
    }
    break;
  case 10:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    lVar9 = value_to_map(v);
    lVar10 = value_type_count(v);
    for (lVar18 = 0; lVar10 != lVar18; lVar18 = lVar18 + 1) {
      puVar11 = (undefined8 *)value_to_array(*(undefined8 *)(lVar9 + lVar18 * 8));
      _ostream = 0;
      s._M_dataplus._M_p = (pointer)0x0;
      s._M_string_length = 0;
      rapid_json_serial_impl_serialize_value((value)*puVar11,(Value *)&ostream);
      rapid_json_serial_impl_serialize_value((value)puVar11[1],(Value *)&s);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&ostream,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&s,&rapid_json_allocator);
    }
    break;
  case 0xb:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostream);
    value_to_ptr(v);
    std::ostream::_M_insert<void_const*>(&ostream);
    std::__cxx11::stringbuf::str();
    _Var16._M_p = "";
    if (s._M_dataplus._M_p != (pointer)0x0) {
      _Var16 = s._M_dataplus;
    }
    (json_v->data_).s.str = (Ch *)((ulong)_Var16._M_p | 0x405000000000000);
    (json_v->data_).s.length = (SizeType)s._M_string_length;
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostream);
    break;
  case 0xc:
    pcVar6 = "[Future]";
    goto LAB_001027a9;
  case 0xd:
    (json_v->data_).s.str = (Ch *)0x40500000010713a;
    (json_v->data_).s.length = 10;
    break;
  case 0xe:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    break;
  case 0xf:
    (json_v->data_).s.str = (Ch *)0x405000000107145;
    (json_v->data_).s.length = 7;
    break;
  case 0x10:
    pcVar6 = "[Object]";
LAB_001027a9:
    (json_v->data_).s.str = (Ch *)((ulong)pcVar6 | 0x405000000000000);
    (json_v->data_).s.length = 8;
    break;
  case 0x11:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    uVar8 = value_to_exception(v);
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length = 0;
    _ostream = 7;
    puVar5 = (undefined1 *)exception_message(uVar8);
    pcVar6 = (char *)exception_message(uVar8);
    sVar7 = strlen(pcVar6);
    if (puVar5 == (undefined1 *)0x0) {
      puVar5 = &rapidjson::GenericStringRef<char>::emptyString;
    }
    s._M_string_length = (ulong)puVar5 | 0x405000000000000;
    s._M_dataplus._M_p._0_4_ = (int)sVar7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&ostream,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&s,&rapid_json_allocator);
    label_value.data_.n = (Number)0x0;
    label_value.data_.s.str = (Ch *)0x0;
    label_member.data_.s.str = (Ch *)0x40500000010715e;
    label_member.data_.n = (Number)0x5;
    puVar5 = (undefined1 *)exception_label(uVar8);
    pcVar6 = (char *)exception_label(uVar8);
    sVar7 = strlen(pcVar6);
    if (puVar5 == (undefined1 *)0x0) {
      puVar5 = &rapidjson::GenericStringRef<char>::emptyString;
    }
    label_value.data_.s.str = (Ch *)((ulong)puVar5 | 0x405000000000000);
    label_value.data_.s.length = (int)sVar7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,&label_member,&label_value,&rapid_json_allocator);
    code_member.data_.s.str = (Ch *)0x405000000107164;
    code_member.data_.n = (Number)0x4;
    local_1d8.n = (Number)exception_error_code(uVar8);
    local_1d8.s.str = (Ch *)0x96000000000000;
    if ((long)local_1d8.n < 0) {
      uVar19 = 0xb6;
      if (0xffffffff7fffffff < (ulong)local_1d8.n) goto LAB_00102db5;
    }
    else {
      uVar19 = 0x1f6;
      if (((ulong)local_1d8.n & 0xffffffff80000000) != 0) {
        uVar19 = (ushort)((ulong)local_1d8.n >> 0x20 == 0) << 6 | 0x196;
      }
LAB_00102db5:
      local_1d8.s.str = (Ch *)((ulong)uVar19 << 0x30);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,&code_member,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_1d8.s,&rapid_json_allocator);
    stacktrace_value.data_.n = (Number)0x0;
    stacktrace_value.data_.s.str = (Ch *)0x0;
    stacktrace_member.data_.s.str = (Ch *)0x405000000107169;
    stacktrace_member.data_.n = (Number)0xa;
    puVar13 = (undefined1 *)exception_stacktrace(uVar8);
    pcVar6 = (char *)exception_stacktrace(uVar8);
    sVar7 = strlen(pcVar6);
    puVar5 = &rapidjson::GenericStringRef<char>::emptyString;
    if (puVar13 != (undefined1 *)0x0) {
      puVar5 = puVar13;
    }
    stacktrace_value.data_.s.str = (Ch *)((ulong)puVar5 | 0x405000000000000);
    stacktrace_value.data_.s.length = (int)sVar7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,&stacktrace_member,&stacktrace_value,&rapid_json_allocator);
    break;
  case 0x12:
    (json_v->data_).n = (Number)0x0;
    (json_v->data_).s.str = (Ch *)0x0;
    (json_v->data_).f.flags = 3;
    uVar8 = value_to_throwable(v);
    s._M_dataplus._M_p = (pointer)0x0;
    s._M_string_length = 0;
    _ostream = 0xf;
    v_00 = (value)throwable_value(uVar8);
    rapid_json_serial_impl_serialize_value(v_00,(Value *)&s);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    DoAddMember(json_v,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&ostream,
                (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&s,&rapid_json_allocator);
  }
  return;
}

Assistant:

void rapid_json_serial_impl_serialize_value(value v, rapidjson::Value *json_v)
{
	type_id id = value_type_id(v);

	if (id == TYPE_BOOL)
	{
		boolean b = value_to_bool(v);

		json_v->SetBool(b == 1L ? true : false);
	}
	else if (id == TYPE_CHAR)
	{
		char str[1];

		rapidjson::SizeType length = 1;

		str[0] = value_to_char(v);

		json_v->SetString(str, length);
	}
	else if (id == TYPE_SHORT)
	{
		short s = value_to_short(v);

		int i = (int)s;

		json_v->SetInt(i);
	}
	else if (id == TYPE_INT)
	{
		int i = value_to_int(v);

		json_v->SetInt(i);
	}
	else if (id == TYPE_LONG)
	{
		long l = value_to_long(v);

		log_write("metacall", LOG_LEVEL_WARNING, "Casting long to int64_t (posible incompatible types) in RapidJSON implementation");

		json_v->SetInt64(l);
	}
	else if (id == TYPE_FLOAT)
	{
		float f = value_to_float(v);

		json_v->SetFloat(f);
	}
	else if (id == TYPE_DOUBLE)
	{
		double d = value_to_double(v);

		json_v->SetDouble(d);
	}
	else if (id == TYPE_STRING)
	{
		const char *str = value_to_string(v);

		size_t size = value_type_size(v);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_BUFFER)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		rapidjson::Value json_array(rapidjson::kArrayType);

		void *buffer = value_to_buffer(v);

		size_t size = value_type_size(v);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			const char *data = (const char *)(((uintptr_t)buffer) + iterator);

			rapidjson::Value json_inner_value;

			json_inner_value.SetUint((unsigned int)*data);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}

		// Set data
		{
			rapidjson::Value json_member;

			json_member.SetString("data");

			json_map.AddMember(json_member, json_array, rapid_json_allocator);
		}

		// Set length
		{
			rapidjson::Value json_member, json_inner_value;

			json_member.SetString("length");

			json_inner_value.SetUint64((uint64_t)size);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_ARRAY)
	{
		rapidjson::Value &json_array = json_v->SetArray();

		value *value_array = value_to_array(v);

		size_t array_size = value_type_count(v);

		for (size_t iterator = 0; iterator < array_size; ++iterator)
		{
			value current_value = value_array[iterator];

			rapidjson::Value json_inner_value;

			rapid_json_serial_impl_serialize_value(current_value, &json_inner_value);

			json_array.PushBack(json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_MAP)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		value *value_map = value_to_map(v);

		size_t map_size = value_type_count(v);

		for (size_t iterator = 0; iterator < map_size; ++iterator)
		{
			value tupla = value_map[iterator];

			value *tupla_array = value_to_array(tupla);

			rapidjson::Value json_member, json_inner_value;

			rapid_json_serial_impl_serialize_value(tupla_array[0], &json_member);

			rapid_json_serial_impl_serialize_value(tupla_array[1], &json_inner_value);

			json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
		}
	}
	else if (id == TYPE_FUTURE)
	{
		/* TODO: Improve future serialization */
		static const char str[] = "[Future]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_FUNCTION)
	{
		/* TODO: Improve function serialization */
		static const char str[] = "[Function]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_CLASS)
	{
		/* TODO: Improve class serialization */
		static const char str[] = "[Class]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_OBJECT)
	{
		/* TODO: Improve object serialization */
		static const char str[] = "[Object]";

		size_t size = sizeof(str);

		rapidjson::SizeType length = size > 0 ? (rapidjson::SizeType)(size - 1) : 0;

		json_v->SetString(str, length);
	}
	else if (id == TYPE_EXCEPTION)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		exception ex = value_to_exception(v);

		rapidjson::Value message_member, message_value;
		static const char message_str[] = "message";

		message_member.SetString(message_str, (rapidjson::SizeType)(sizeof(message_str) - 1));
		message_value.SetString(exception_message(ex), strlen(exception_message(ex)));
		json_map.AddMember(message_member, message_value, rapid_json_allocator);

		rapidjson::Value label_member, label_value;
		static const char label_str[] = "label";

		label_member.SetString(label_str, (rapidjson::SizeType)(sizeof(label_str) - 1));
		label_value.SetString(exception_label(ex), strlen(exception_label(ex)));
		json_map.AddMember(label_member, label_value, rapid_json_allocator);

		rapidjson::Value code_member, code_value;
		static const char code_str[] = "code";

		code_member.SetString(code_str, (rapidjson::SizeType)(sizeof(code_str) - 1));
		code_value.SetInt64(exception_error_code(ex));
		json_map.AddMember(code_member, code_value, rapid_json_allocator);

		rapidjson::Value stacktrace_member, stacktrace_value;
		static const char stacktrace_str[] = "stacktrace";

		stacktrace_member.SetString(stacktrace_str, (rapidjson::SizeType)(sizeof(stacktrace_str) - 1));
		stacktrace_value.SetString(exception_stacktrace(ex), strlen(exception_stacktrace(ex)));
		json_map.AddMember(stacktrace_member, stacktrace_value, rapid_json_allocator);
	}
	else if (id == TYPE_THROWABLE)
	{
		rapidjson::Value &json_map = json_v->SetObject();

		throwable th = value_to_throwable(v);

		static const char str[] = "ExceptionThrown";

		size_t size = sizeof(str);

		rapidjson::SizeType length = (rapidjson::SizeType)(size - 1);

		rapidjson::Value json_member, json_inner_value;

		json_member.SetString(str, length);

		rapid_json_serial_impl_serialize_value(throwable_value(th), &json_inner_value);

		json_map.AddMember(json_member, json_inner_value, rapid_json_allocator);
	}
	else if (id == TYPE_PTR)
	{
		std::ostringstream ostream;

		ostream << value_to_ptr(v);

		std::string s = ostream.str();

		json_v->SetString(s.c_str(), (rapidjson::SizeType)s.length());
	}
	else if (id == TYPE_NULL)
	{
		json_v->SetNull();
	}
}